

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprDelete(sqlite3 *db,Expr *p)

{
  if (p != (Expr *)0x0) {
    if ((p->flags & 0x4000) == 0) {
      sqlite3ExprDelete(db,p->pLeft);
      sqlite3ExprDelete(db,p->pRight);
      if (((p->flags & 0x2000) == 0) && ((p->flags2 & 1) != 0)) {
        sqlite3DbFree(db,(p->u).zToken);
      }
      if ((p->flags & 0x800) == 0) {
        sqlite3ExprListDelete(db,(p->x).pList);
      }
      else {
        sqlite3SelectDelete(db,(Select *)(p->x).pList);
      }
    }
    if (-1 < (short)p->flags) {
      sqlite3DbFree(db,p);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprDelete(sqlite3 *db, Expr *p){
  if( p==0 ) return;
  /* Sanity check: Assert that the IntValue is non-negative if it exists */
  assert( !ExprHasProperty(p, EP_IntValue) || p->u.iValue>=0 );
  if( !ExprHasAnyProperty(p, EP_TokenOnly) ){
    sqlite3ExprDelete(db, p->pLeft);
    sqlite3ExprDelete(db, p->pRight);
    if( !ExprHasProperty(p, EP_Reduced) && (p->flags2 & EP2_MallocedToken)!=0 ){
      sqlite3DbFree(db, p->u.zToken);
    }
    if( ExprHasProperty(p, EP_xIsSelect) ){
      sqlite3SelectDelete(db, p->x.pSelect);
    }else{
      sqlite3ExprListDelete(db, p->x.pList);
    }
  }
  if( !ExprHasProperty(p, EP_Static) ){
    sqlite3DbFree(db, p);
  }
}